

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgem.cpp
# Opt level: O2

void test_font_get(void)

{
  ostream *poVar1;
  bool is_underline;
  bool is_italic;
  bool is_bold;
  Am_Font_Family_Flag f;
  Am_String font_name;
  Am_Font_Size_Flag s;
  Am_Font lf;
  Am_Font defaultfont;
  
  Am_Font::Am_Font(&defaultfont,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
  Am_Font::Am_Font(&lf,Am_FONT_SERIF,true,false,true,Am_FONT_VERY_LARGE);
  font_name.data = (Am_String_Data *)0x0;
  std::operator<<((ostream *)&std::cout,"For default font, values are: \n");
  std::ostream::flush();
  Am_Font::Get((Am_String *)&defaultfont,(Am_Font_Family_Flag *)&font_name,(bool *)&f,&is_bold,
               &is_italic,(Am_Font_Size_Flag *)&is_underline);
  poVar1 = std::operator<<((ostream *)&std::cout,"name ");
  poVar1 = (ostream *)operator<<(poVar1,&font_name);
  poVar1 = std::operator<<(poVar1," family ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,f);
  poVar1 = std::operator<<(poVar1," bold ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," italic ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," underline ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," size ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  std::operator<<((ostream *)&std::cout,"For font serif,bold,underline,very_large, values are:\n");
  std::ostream::flush();
  Am_Font::Get((Am_String *)&lf,(Am_Font_Family_Flag *)&font_name,(bool *)&f,&is_bold,&is_italic,
               (Am_Font_Size_Flag *)&is_underline);
  poVar1 = std::operator<<((ostream *)&std::cout,"name ");
  poVar1 = (ostream *)operator<<(poVar1,&font_name);
  poVar1 = std::operator<<(poVar1," family ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,f);
  poVar1 = std::operator<<(poVar1," bold ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," italic ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," underline ");
  poVar1 = std::ostream::_M_insert<bool>(SUB81(poVar1,0));
  poVar1 = std::operator<<(poVar1," size ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ostream::flush();
  Am_String::~Am_String(&font_name);
  Am_Font::~Am_Font(&lf);
  Am_Font::~Am_Font(&defaultfont);
  return;
}

Assistant:

void
test_font_get()
{
  Am_Font defaultfont = Am_Font();
  Am_Font lf(Am_FONT_SERIF, true, false, true, Am_FONT_VERY_LARGE);
  Am_String font_name;
  Am_Font_Family_Flag f;
  bool is_bold;
  bool is_italic;
  bool is_underline;
  Am_Font_Size_Flag s;

  std::cout << "For default font, values are: \n" << std::flush;
  defaultfont.Get(font_name, f, is_bold, is_italic, is_underline, s);
  std::cout << "name " << font_name << " family " << (int)f << " bold "
            << is_bold << " italic " << is_italic << " underline "
            << is_underline << " size " << (int)s << std::endl
            << std::flush;

  std::cout << "For font serif,bold,underline,very_large, values are:\n"
            << std::flush;
  lf.Get(font_name, f, is_bold, is_italic, is_underline, s);
  std::cout << "name " << font_name << " family " << (int)f << " bold "
            << is_bold << " italic " << is_italic << " underline "
            << is_underline << " size " << (int)s << std::endl
            << std::flush;
}